

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.hpp
# Opt level: O3

string * OpenMD::toString<int>(string *__return_storage_ptr__,int *v)

{
  long *plVar1;
  ostringstream oss;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  plVar1 = (long *)std::ostream::operator<<(local_190,*v);
  if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"toString Error",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(const T& v) {
    std::ostringstream oss;
    if (!(oss << v)) { std::cerr << "toString Error" << std::endl; }
    return oss.str();
  }